

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::edit_distance::CreateUnifiedDiff
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *right,size_t context)

{
  EditType EVar1;
  string *psVar2;
  ulong uVar3;
  _List_node_base *p_Var4;
  ostream *poVar5;
  size_t sVar6;
  ulong uVar7;
  pointer pEVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  char edit;
  long lVar13;
  list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *plVar14;
  _List_node_base *p_Var15;
  ulong uVar16;
  ulong uVar17;
  size_t i;
  size_t sVar18;
  bool bVar19;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  edits;
  Hunk hunk;
  stringstream ss;
  char local_269;
  size_t local_268;
  ulong local_260;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  local_258;
  Hunk local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d0;
  string *local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_268 = context;
  local_1c8 = __return_storage_ptr__;
  local_1c0 = right;
  CalculateOptimalEdits(&local_258,left,right);
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar10 = 0;
  uVar17 = 0;
  lVar12 = 0;
  local_1d0 = left;
  do {
    plVar14 = &local_240.hunk_adds_;
    uVar3 = (long)local_258.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_258.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2;
    if (uVar3 <= uVar17) break;
    uVar7 = (uVar10 + uVar3) - uVar17;
    lVar13 = (uVar3 + lVar12) - uVar17;
    uVar9 = uVar10;
    lVar11 = lVar12;
    uVar16 = uVar17;
    do {
      uVar10 = uVar9;
      lVar12 = lVar11;
      uVar17 = uVar16;
      if (local_258.
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar16] != kMatch) break;
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 1;
      uVar16 = uVar16 + 1;
      uVar10 = uVar7;
      lVar12 = lVar13;
      uVar17 = uVar3;
    } while (uVar3 != uVar16);
    sVar18 = local_268;
    if (uVar10 < local_268) {
      sVar18 = uVar10;
    }
    local_240.left_start_ = (uVar10 - sVar18) + 1;
    local_240.right_start_ = (lVar12 - sVar18) + 1;
    local_240.common_ = 0;
    local_240.adds_ = 0;
    local_240.removes_ = 0;
    local_240.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_240.hunk_;
    local_240.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    local_240.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    local_240.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_240.hunk_removes_;
    local_240.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    local_240.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_240.hunk_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    local_240.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar14;
    local_240.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar14;
    local_240.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_240.hunk_removes_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    if (sVar18 != 0) {
      lVar11 = uVar10 * 0x20 + sVar18 * -0x20;
      do {
        anon_unknown_1::Hunk::PushLine
                  (&local_240,' ',
                   *(char **)((long)&(((left->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar11));
        lVar11 = lVar11 + 0x20;
        sVar18 = sVar18 - 1;
      } while (sVar18 != 0);
    }
    if (uVar17 < (ulong)((long)local_258.
                               super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_258.
                               super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2)) {
      lVar11 = uVar17 * 4;
      uVar3 = 0;
      do {
        lVar11 = (lVar11 << 0x1e) >> 0x1e;
        if (local_268 <= uVar3) {
          pEVar8 = local_258.
                   super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)uVar17;
          bVar19 = pEVar8 == local_258.
                             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar19) break;
          if (*pEVar8 == kMatch) {
            pEVar8 = (pointer)((long)local_258.
                                     super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar11);
            do {
              pEVar8 = pEVar8 + 1;
              bVar19 = pEVar8 == local_258.
                                 super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
              if (bVar19) goto LAB_001287cd;
            } while (*pEVar8 == kMatch);
          }
          if ((bVar19) ||
             (local_268 <=
              ((long)pEVar8 -
               (long)local_258.
                     super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) - uVar17)) break;
        }
        EVar1 = local_258.
                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar17];
        local_260 = uVar3 + 1;
        if (EVar1 != kMatch) {
          local_260 = 0;
        }
        if ((EVar1 < 4) && (EVar1 != kAdd)) {
          edit = '-';
          if (EVar1 == kMatch) {
            edit = ' ';
          }
          anon_unknown_1::Hunk::PushLine
                    (&local_240,edit,
                     (local_1d0->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p);
        }
        if ((EVar1 & ~kRemove) == kAdd) {
          p_Var15 = (_List_node_base *)
                    (local_1c0->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar12]._M_dataplus._M_p;
          local_240.adds_ = local_240.adds_ + 1;
          p_Var4 = (_List_node_base *)operator_new(0x20);
          *(undefined1 *)&p_Var4[1]._M_next = 0x2b;
          p_Var4[1]._M_prev = p_Var15;
          std::__detail::_List_node_base::_M_hook(p_Var4);
          local_240.hunk_adds_.
          super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
          ._M_impl._M_node._M_size =
               local_240.hunk_adds_.
               super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
               ._M_impl._M_node._M_size + 1;
        }
        uVar10 = uVar10 + (EVar1 != kAdd);
        lVar12 = lVar12 + (ulong)(EVar1 != kRemove);
        uVar17 = uVar17 + 1;
        lVar11 = lVar11 + 4;
        uVar3 = local_260;
      } while (uVar17 < (ulong)((long)local_258.
                                      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_258.
                                      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2));
    }
LAB_001287cd:
    local_260 = CONCAT71(local_260._1_7_,local_240.removes_ != 0 || local_240.adds_ != 0);
    if (local_240.removes_ != 0 || local_240.adds_ != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"@@ ",3);
      if (local_240.removes_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"-",1);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      }
      if ((local_240.removes_ != 0) && (local_240.adds_ != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      }
      if (local_240.adds_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"+",1);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," @@\n",4);
      anon_unknown_1::Hunk::FlushEdits(&local_240);
      for (p_Var15 = local_240.hunk_.
                     super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
          p_Var15 != (_List_node_base *)&local_240.hunk_; p_Var15 = p_Var15->_M_next) {
        local_269 = *(char *)&p_Var15[1]._M_next;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_269,1);
        p_Var4 = p_Var15[1]._M_prev;
        if (p_Var4 == (_List_node_base *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar6 = strlen((char *)p_Var4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)p_Var4,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      }
    }
    p_Var15 = local_240.hunk_removes_.
              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    left = local_1d0;
    while (local_1d0 = left, p_Var15 != (_List_node_base *)&local_240.hunk_removes_) {
      p_Var4 = (((_List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var15,0x20);
      p_Var15 = p_Var4;
      left = local_1d0;
    }
    p_Var15 = local_240.hunk_adds_.
              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var15 != (_List_node_base *)&local_240.hunk_adds_) {
      p_Var4 = (((_List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var15,0x20);
      p_Var15 = p_Var4;
    }
    p_Var15 = local_240.hunk_.
              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (local_240.hunk_.
        super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_240.hunk_) {
      do {
        p_Var4 = (((_List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                    *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var15,0x20);
        p_Var15 = p_Var4;
      } while (p_Var4 != (_List_node_base *)&local_240.hunk_);
    }
  } while ((char)local_260 != '\0');
  psVar2 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_258.
      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.
                    super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return psVar2;
}

Assistant:

std::string CreateUnifiedDiff(const std::vector<std::string>& left,
                              const std::vector<std::string>& right,
                              size_t context) {
  const std::vector<EditType> edits = CalculateOptimalEdits(left, right);

  size_t l_i = 0, r_i = 0, edit_i = 0;
  std::stringstream ss;
  while (edit_i < edits.size()) {
    // Find first edit.
    while (edit_i < edits.size() && edits[edit_i] == kMatch) {
      ++l_i;
      ++r_i;
      ++edit_i;
    }

    // Find the first line to include in the hunk.
    const size_t prefix_context = std::min(l_i, context);
    Hunk hunk(l_i - prefix_context + 1, r_i - prefix_context + 1);
    for (size_t i = prefix_context; i > 0; --i) {
      hunk.PushLine(' ', left[l_i - i].c_str());
    }

    // Iterate the edits until we found enough suffix for the hunk or the input
    // is over.
    size_t n_suffix = 0;
    for (; edit_i < edits.size(); ++edit_i) {
      if (n_suffix >= context) {
        // Continue only if the next hunk is very close.
        auto it = edits.begin() + static_cast<int>(edit_i);
        while (it != edits.end() && *it == kMatch) ++it;
        if (it == edits.end() ||
            static_cast<size_t>(it - edits.begin()) - edit_i >= context) {
          // There is no next edit or it is too far away.
          break;
        }
      }

      EditType edit = edits[edit_i];
      // Reset count when a non match is found.
      n_suffix = edit == kMatch ? n_suffix + 1 : 0;

      if (edit == kMatch || edit == kRemove || edit == kReplace) {
        hunk.PushLine(edit == kMatch ? ' ' : '-', left[l_i].c_str());
      }
      if (edit == kAdd || edit == kReplace) {
        hunk.PushLine('+', right[r_i].c_str());
      }

      // Advance indices, depending on edit type.
      l_i += edit != kAdd;
      r_i += edit != kRemove;
    }

    if (!hunk.has_edits()) {
      // We are done. We don't want this hunk.
      break;
    }

    hunk.PrintTo(&ss);
  }
  return ss.str();
}